

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  Byte *pBVar1;
  uint8_t *data;
  ssize_t bytes_avail;
  zip *zip;
  archive_read *a;
  void *p_local;
  
  zip = *p;
  bytes_avail = **(ssize_t **)((zip->ppmd8).See[3] + 0x14);
  data = (uint8_t *)0x0;
  a = (archive_read *)p;
  pBVar1 = (Byte *)__archive_read_ahead((archive_read *)zip,1,(ssize_t *)&data);
  if ((long)data < 1) {
    *(undefined1 *)(bytes_avail + 0x1ec9) = 1;
    p_local._7_1_ = '\0';
  }
  else {
    __archive_read_consume((archive_read *)zip,1);
    *(long *)(bytes_avail + 0x1e0) = *(long *)(bytes_avail + 0x1e0) + 1;
    p_local._7_1_ = *pBVar1;
  }
  return p_local._7_1_;
}

Assistant:

static Byte
ppmd_read(void* p) {
	/* Get the handle to current decompression context. */
	struct archive_read *a = ((IByteIn*)p)->a;
	struct zip *zip = (struct zip*) a->format->data;
	ssize_t bytes_avail = 0;

	/* Fetch next byte. */
	const uint8_t* data = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 1) {
		zip->ppmd8_stream_failed = 1;
		return 0;
	}

	__archive_read_consume(a, 1);

	/* Increment the counter. */
	++zip->zipx_ppmd_read_compressed;

	/* Return the next compressed byte. */
	return data[0];
}